

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

char * llama_print_system_info(void)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28;
  
  if (llama_print_system_info()::s_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&llama_print_system_info()::s_abi_cxx11_);
    if (iVar1 != 0) {
      llama_print_system_info()::s_abi_cxx11_._M_dataplus._M_p =
           (pointer)&llama_print_system_info()::s_abi_cxx11_.field_2;
      llama_print_system_info()::s_abi_cxx11_._M_string_length = 0;
      llama_print_system_info()::s_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&llama_print_system_info()::s_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&llama_print_system_info()::s_abi_cxx11_);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&llama_print_system_info()::s_abi_cxx11_,"");
  iVar1 = ggml_cpu_has_avx();
  std::__cxx11::to_string(&local_28,iVar1);
  std::operator+(&bStack_68,"AVX = ",&local_28);
  std::operator+(&local_48,&bStack_68," | ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&llama_print_system_info()::s_abi_cxx11_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  iVar1 = ggml_cpu_has_avx2();
  std::__cxx11::to_string(&local_28,iVar1);
  std::operator+(&bStack_68,"AVX2 = ",&local_28);
  std::operator+(&local_48,&bStack_68," | ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&llama_print_system_info()::s_abi_cxx11_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  iVar1 = ggml_cpu_has_avx512();
  std::__cxx11::to_string(&local_28,iVar1);
  std::operator+(&bStack_68,"AVX512 = ",&local_28);
  std::operator+(&local_48,&bStack_68," | ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&llama_print_system_info()::s_abi_cxx11_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  iVar1 = ggml_cpu_has_fma();
  std::__cxx11::to_string(&local_28,iVar1);
  std::operator+(&bStack_68,"FMA = ",&local_28);
  std::operator+(&local_48,&bStack_68," | ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&llama_print_system_info()::s_abi_cxx11_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  iVar1 = ggml_cpu_has_neon();
  std::__cxx11::to_string(&local_28,iVar1);
  std::operator+(&bStack_68,"NEON = ",&local_28);
  std::operator+(&local_48,&bStack_68," | ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&llama_print_system_info()::s_abi_cxx11_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  iVar1 = ggml_cpu_has_arm_fma();
  std::__cxx11::to_string(&local_28,iVar1);
  std::operator+(&bStack_68,"ARM_FMA = ",&local_28);
  std::operator+(&local_48,&bStack_68," | ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&llama_print_system_info()::s_abi_cxx11_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  iVar1 = ggml_cpu_has_f16c();
  std::__cxx11::to_string(&local_28,iVar1);
  std::operator+(&bStack_68,"F16C = ",&local_28);
  std::operator+(&local_48,&bStack_68," | ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&llama_print_system_info()::s_abi_cxx11_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  iVar1 = ggml_cpu_has_fp16_va();
  std::__cxx11::to_string(&local_28,iVar1);
  std::operator+(&bStack_68,"FP16_VA = ",&local_28);
  std::operator+(&local_48,&bStack_68," | ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&llama_print_system_info()::s_abi_cxx11_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  iVar1 = ggml_cpu_has_wasm_simd();
  std::__cxx11::to_string(&local_28,iVar1);
  std::operator+(&bStack_68,"WASM_SIMD = ",&local_28);
  std::operator+(&local_48,&bStack_68," | ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&llama_print_system_info()::s_abi_cxx11_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  iVar1 = ggml_cpu_has_blas();
  std::__cxx11::to_string(&local_28,iVar1);
  std::operator+(&bStack_68,"BLAS = ",&local_28);
  std::operator+(&local_48,&bStack_68," | ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&llama_print_system_info()::s_abi_cxx11_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  iVar1 = ggml_cpu_has_sse3();
  std::__cxx11::to_string(&local_28,iVar1);
  std::operator+(&bStack_68,"SSE3 = ",&local_28);
  std::operator+(&local_48,&bStack_68," | ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&llama_print_system_info()::s_abi_cxx11_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  iVar1 = ggml_cpu_has_vsx();
  std::__cxx11::to_string(&local_28,iVar1);
  std::operator+(&bStack_68,"VSX = ",&local_28);
  std::operator+(&local_48,&bStack_68," | ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&llama_print_system_info()::s_abi_cxx11_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  return llama_print_system_info()::s_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char * llama_print_system_info(void) {
    static std::string s;

    s  = "";
    s += "AVX = "       + std::to_string(ggml_cpu_has_avx())       + " | ";
    s += "AVX2 = "      + std::to_string(ggml_cpu_has_avx2())      + " | ";
    s += "AVX512 = "    + std::to_string(ggml_cpu_has_avx512())    + " | ";
    s += "FMA = "       + std::to_string(ggml_cpu_has_fma())       + " | ";
    s += "NEON = "      + std::to_string(ggml_cpu_has_neon())      + " | ";
    s += "ARM_FMA = "   + std::to_string(ggml_cpu_has_arm_fma())   + " | ";
    s += "F16C = "      + std::to_string(ggml_cpu_has_f16c())      + " | ";
    s += "FP16_VA = "   + std::to_string(ggml_cpu_has_fp16_va())   + " | ";
    s += "WASM_SIMD = " + std::to_string(ggml_cpu_has_wasm_simd()) + " | ";
    s += "BLAS = "      + std::to_string(ggml_cpu_has_blas())      + " | ";
    s += "SSE3 = "      + std::to_string(ggml_cpu_has_sse3())      + " | ";
    s += "VSX = "       + std::to_string(ggml_cpu_has_vsx())       + " | ";

    return s.c_str();
}